

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int getNetherBiome(NetherNoise *nn,int x,int y,int z,float *ndel)

{
  ulong uVar1;
  float *pfVar2;
  ulong uVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  dVar5 = sampleDoublePerlin(&nn->temperature,(double)x,0.0,(double)z);
  dVar6 = sampleDoublePerlin(&nn->humidity,(double)x,0.0,(double)z);
  uVar1 = 0;
  pfVar2 = (float *)&DAT_0012ead8;
  uVar3 = 0;
  fVar7 = 3.4028235e+38;
  fVar9 = 3.4028235e+38;
  do {
    fVar8 = (pfVar2[-2] - (float)dVar5) * (pfVar2[-2] - (float)dVar5) +
            (pfVar2[-1] - (float)dVar6) * (pfVar2[-1] - (float)dVar6) + *pfVar2;
    if (fVar9 <= fVar8) {
      fVar4 = fVar9;
      if (fVar8 < fVar7) {
        fVar7 = fVar8;
      }
    }
    else {
      uVar3 = uVar1 & 0xffffffff;
      fVar4 = fVar8;
      fVar7 = fVar9;
    }
    uVar1 = uVar1 + 1;
    pfVar2 = pfVar2 + 4;
    fVar9 = fVar4;
  } while (uVar1 != 5);
  if (ndel != (float *)0x0) {
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    *ndel = fVar7 - fVar4;
  }
  return (int)*(float *)(&DAT_0012eadc + (long)(int)uVar3 * 0x10);
}

Assistant:

int getNetherBiome(const NetherNoise *nn, int x, int y, int z, float *ndel)
{
    const float npoints[5][4] = {
        { 0,    0,      0,              nether_wastes       },
        { 0,   -0.5,    0,              soul_sand_valley    },
        { 0.4,  0,      0,              crimson_forest      },
        { 0,    0.5,    0.375*0.375,    warped_forest       },
        {-0.5,  0,      0.175*0.175,    basalt_deltas       },
    };

    y = 0;
    float temp = sampleDoublePerlin(&nn->temperature, x, y, z);
    float humidity = sampleDoublePerlin(&nn->humidity, x, y, z);

    int i, id = 0;
    float dmin = FLT_MAX;
    float dmin2 = FLT_MAX;
    for (i = 0; i < 5; i++)
    {
        float dx = npoints[i][0] - temp;
        float dy = npoints[i][1] - humidity;
        float dsq = dx*dx + dy*dy + npoints[i][2];
        if (dsq < dmin)
        {
            dmin2 = dmin;
            dmin = dsq;
            id = i;
        }
        else if (dsq < dmin2)
            dmin2 = dsq;
    }

    if (ndel)
        *ndel = sqrtf(dmin2) - sqrtf(dmin);

    id = (int) npoints[id][3];
    return id;
}